

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_device_data_loop__pulse(ma_device *pDevice)

{
  int iVar1;
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x48ce,"ma_result ma_device_data_loop__pulse(ma_device *)");
  }
  do {
    if (pDevice->state != ma_device_state_started) {
      return MA_SUCCESS;
    }
    iVar1 = (*(pDevice->pContext->field_14).alsa.snd_pcm_hw_params_set_format)
                      ((pDevice->field_24).alsa.pPCMPlayback,1,0);
  } while (-1 < iVar1);
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_device_data_loop__pulse(ma_device* pDevice)
{
    int resultPA;

    MA_ASSERT(pDevice != NULL);

    /* NOTE: Don't start the device here. It'll be done at a higher level. */

    /*
    All data is handled through callbacks. All we need to do is iterate over the main loop and let
    the callbacks deal with it.
    */
    while (ma_device_get_state(pDevice) == ma_device_state_started) {
        resultPA = ((ma_pa_mainloop_iterate_proc)pDevice->pContext->pulse.pa_mainloop_iterate)((ma_pa_mainloop*)pDevice->pulse.pMainLoop, 1, NULL);
        if (resultPA < 0) {
            break;
        }
    }

    /* NOTE: Don't stop the device here. It'll be done at a higher level. */
    return MA_SUCCESS;
}